

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme_examples.c
# Opt level: O0

char * create_monitor(void)

{
  cJSON *object;
  cJSON *pcVar1;
  cJSON *item;
  cJSON *pcVar2;
  long in_FS_OFFSET;
  cJSON *monitor;
  size_t index;
  cJSON *height;
  cJSON *width;
  cJSON *resolution;
  cJSON *resolutions;
  cJSON *name;
  char *string;
  uint resolution_numbers [3] [2];
  
  resolution_numbers[2] = *(uint (*) [2])(in_FS_OFFSET + 0x28);
  resolution_numbers[0][0] = 0x780;
  resolution_numbers[0][1] = 0x438;
  resolution_numbers[1][0] = 0xf00;
  resolution_numbers[1][1] = 0x870;
  name = (cJSON *)0x0;
  object = cJSON_CreateObject();
  if ((object != (cJSON *)0x0) &&
     (pcVar1 = cJSON_CreateString("Awesome 4K"), pcVar1 != (cJSON *)0x0)) {
    cJSON_AddItemToObject(object,"name",pcVar1);
    pcVar1 = cJSON_CreateArray();
    if (pcVar1 != (cJSON *)0x0) {
      cJSON_AddItemToObject(object,"resolutions",pcVar1);
      for (monitor = (cJSON *)0x0; monitor < (cJSON *)0x3;
          monitor = (cJSON *)((long)&monitor->next + 1)) {
        item = cJSON_CreateObject();
        if (item == (cJSON *)0x0) goto LAB_00108ba9;
        cJSON_AddItemToArray(pcVar1,item);
        pcVar2 = cJSON_CreateNumber((double)resolution_numbers
                                            [(long)((long)&monitor[-1].string + 7)][0]);
        if (pcVar2 == (cJSON *)0x0) goto LAB_00108ba9;
        cJSON_AddItemToObject(item,"width",pcVar2);
        pcVar2 = cJSON_CreateNumber((double)resolution_numbers
                                            [(long)((long)&monitor[-1].string + 7)][1]);
        if (pcVar2 == (cJSON *)0x0) goto LAB_00108ba9;
        cJSON_AddItemToObject(item,"height",pcVar2);
      }
      name = (cJSON *)cJSON_Print(object);
      if (name == (cJSON *)0x0) {
        fprintf(_stderr,"Failed to print monitor.\n");
      }
    }
  }
LAB_00108ba9:
  cJSON_Delete(object);
  if (*(uint (*) [2])(in_FS_OFFSET + 0x28) != resolution_numbers[2]) {
    __stack_chk_fail();
  }
  return (char *)name;
}

Assistant:

static char* create_monitor(void)
{
    const unsigned int resolution_numbers[3][2] = {
        {1280, 720},
        {1920, 1080},
        {3840, 2160}
    };
    char *string = NULL;
    cJSON *name = NULL;
    cJSON *resolutions = NULL;
    cJSON *resolution = NULL;
    cJSON *width = NULL;
    cJSON *height = NULL;
    size_t index = 0;

    cJSON *monitor = cJSON_CreateObject();
    if (monitor == NULL)
    {
        goto end;
    }

    name = cJSON_CreateString("Awesome 4K");
    if (name == NULL)
    {
        goto end;
    }
    /* after creation was successful, immediately add it to the monitor,
     * thereby transferring ownership of the pointer to it */
    cJSON_AddItemToObject(monitor, "name", name);

    resolutions = cJSON_CreateArray();
    if (resolutions == NULL)
    {
        goto end;
    }
    cJSON_AddItemToObject(monitor, "resolutions", resolutions);

    for (index = 0; index < (sizeof(resolution_numbers) / (2 * sizeof(int))); ++index)
    {
        resolution = cJSON_CreateObject();
        if (resolution == NULL)
        {
            goto end;
        }
        cJSON_AddItemToArray(resolutions, resolution);

        width = cJSON_CreateNumber(resolution_numbers[index][0]);
        if (width == NULL)
        {
            goto end;
        }
        cJSON_AddItemToObject(resolution, "width", width);

        height = cJSON_CreateNumber(resolution_numbers[index][1]);
        if (height == NULL)
        {
            goto end;
        }
        cJSON_AddItemToObject(resolution, "height", height);
    }

    string = cJSON_Print(monitor);
    if (string == NULL)
    {
        fprintf(stderr, "Failed to print monitor.\n");
    }

end:
    cJSON_Delete(monitor);
    return string;
}